

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O0

char * google::protobuf::internal::TcParser::
       MpPackedVarintT<false,unsigned_int,(unsigned_short)1024>
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  anon_class_40_5_48d9827f add;
  uint32_t uVar1;
  FieldEntry *pFVar2;
  void *x;
  RepeatedField<unsigned_int> *pRVar3;
  FieldAux *pFVar4;
  char *pcVar5;
  FieldAux aux;
  RepeatedField<unsigned_int> *field;
  void *base;
  bool is_validated_enum;
  bool is_zigzag;
  uint16_t xform_val;
  FieldEntry *entry;
  uint64_t hasbits_local;
  TcParseTableBase *table_local;
  ParseContext *ctx_local;
  char *ptr_local;
  MessageLite *msg_local;
  TcFieldData data_local;
  
  msg_local = (MessageLite *)data.field_0;
  uVar1 = TcFieldData::entry_offset((TcFieldData *)&msg_local);
  pFVar2 = RefAt<google::protobuf::internal::TcParseTableBase::FieldEntry>(table,(ulong)uVar1);
  x = MaybeGetSplitBase(msg,false,table);
  pRVar3 = MaybeCreateRepeatedFieldRefAt<unsigned_int,false>(x,(ulong)pFVar2->offset,msg);
  pFVar4 = TcParseTableBase::field_aux(table,(uint)pFVar2->aux_idx);
  data_local.field_0.data._6_2_ = 0x400;
  add.msg = msg;
  add.aux.message_default_p = pFVar4->message_default_p;
  add.table = table;
  add.data.field_0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)msg_local;
  add.field = pRVar3;
  pcVar5 = EpsCopyInputStream::
           ReadPackedVarint<google::protobuf::internal::TcParser::MpPackedVarintT<false,unsigned_int,(unsigned_short)1024>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(int)_1_>
                     (&ctx->super_EpsCopyInputStream,ptr,add);
  return pcVar5;
}

Assistant:

const char* TcParser::MpPackedVarintT(PROTOBUF_TC_PARAM_DECL) {
  const auto& entry = RefAt<FieldEntry>(table, data.entry_offset());
  // For is_split we ignore the incoming xform_val and read it from entry to
  // reduce duplication for the uncommon paths.
  const uint16_t xform_val =
      is_split ? (entry.type_card & field_layout::kTvMask) : xform_val_in;
  const bool is_zigzag = xform_val == field_layout::kTvZigZag;
  const bool is_validated_enum = xform_val & field_layout::kTvEnum;

  void* const base = MaybeGetSplitBase(msg, is_split, table);
  auto* field = &MaybeCreateRepeatedFieldRefAt<FieldType, is_split>(
      base, entry.offset, msg);

  if (is_validated_enum) {
    const TcParseTableBase::FieldAux aux = *table->field_aux(entry.aux_idx);
    PrefetchEnumData(xform_val, aux);
    return ctx->ReadPackedVarint(ptr, [=](int32_t value) {
      if (!EnumIsValidAux(value, xform_val, aux)) {
        AddUnknownEnum(msg, table, data.tag(), value);
      } else {
        field->Add(value);
      }
    });
  } else {
    return ctx->ReadPackedVarint(ptr, [=](uint64_t value) {
      field->Add(is_zigzag ? (sizeof(FieldType) == 8
                                  ? WireFormatLite::ZigZagDecode64(value)
                                  : WireFormatLite::ZigZagDecode32(
                                        static_cast<uint32_t>(value)))
                           : value);
    });
  }
}